

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::apply
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *out,MultiFab *in,BCMode bc_mode,
          StateMode s_mode,MLMGBndry *bndry)

{
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x47])();
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x48])(this,(ulong)(uint)amrlev,(ulong)(uint)mglev,out,in);
  return;
}

Assistant:

void
MLCellLinOp::apply (int amrlev, int mglev, MultiFab& out, MultiFab& in, BCMode bc_mode,
                    StateMode s_mode, const MLMGBndry* bndry) const
{
    BL_PROFILE("MLCellLinOp::apply()");
    applyBC(amrlev, mglev, in, bc_mode, s_mode, bndry);
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.apply(out);
#endif
    Fapply(amrlev, mglev, out, in);
}